

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivySeq.c
# Opt level: O2

Ivy_Store_t * Ivy_CutComputeForNode(Ivy_Man_t *p,Ivy_Obj_t *pObj,int nLeaves)

{
  short sVar1;
  ushort uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  Ivy_Obj_t *pIVar7;
  long lVar8;
  Ivy_Store_t *extraout_RAX;
  long lVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  Ivy_Cut_t CutNew;
  
  Ivy_CutComputeForNode::CutStore.nCutsMax = 0x100;
  CutNew.nSize = 1;
  CutNew.nSizeMax = (short)nLeaves;
  CutNew.pArray[0] = pObj->Id << 8;
  Ivy_CutComputeForNode::CutStore.nCuts = 1;
  Ivy_CutComputeForNode::CutStore.pCuts[0].uHash = 1 << ((byte)(CutNew.pArray[0] % 0x1f) & 0x1f);
  Ivy_CutComputeForNode::CutStore.pCuts[0].pArray._8_8_ = CutNew.pArray._8_8_;
  Ivy_CutComputeForNode::CutStore.pCuts[0].pArray._16_8_ = CutNew.pArray._16_8_;
  Ivy_CutComputeForNode::CutStore.pCuts[0].nSize = 1;
  Ivy_CutComputeForNode::CutStore.pCuts[0].nLatches = CutNew.nLatches;
  Ivy_CutComputeForNode::CutStore.pCuts[0].nSizeMax = CutNew.nSizeMax;
  Ivy_CutComputeForNode::CutStore.pCuts[0].pArray[1] = CutNew.pArray[1];
  Ivy_CutComputeForNode::CutStore.pCuts[0].pArray[0] = CutNew.pArray[0];
  lVar20 = 0xbcf128;
  lVar11 = 0;
  iVar6 = 1;
  CutNew.uHash = Ivy_CutComputeForNode::CutStore.pCuts[0].uHash;
  do {
    if (iVar6 <= lVar11) {
LAB_00630e47:
      Ivy_CutComputeForNode::CutStore.fSatur = (int)(iVar6 == 0x100);
LAB_00630e51:
      Ivy_CutCompactAll(&Ivy_CutComputeForNode::CutStore);
      return extraout_RAX;
    }
    lVar9 = lVar11 * 0x24;
    sVar1 = Ivy_CutComputeForNode::CutStore.pCuts[lVar11].nSize;
    if (sVar1 != 0) {
      for (lVar19 = 0; lVar19 < sVar1; lVar19 = lVar19 + 1) {
        pIVar7 = Ivy_ManObj(p,*(int *)(lVar9 + 0xbcf128 + lVar19 * 4) >> 8);
        uVar4 = *(uint *)&pIVar7->field_0x8 & 0xf;
        if (((uVar4 != 1) && (uVar4 != 4)) && (pIVar7->Id != 0)) {
          if (uVar4 - 7 < 0xfffffffe) {
            __assert_fail("Ivy_ObjIsNode(pLeaf)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivySeq.c"
                          ,0x425,"Ivy_Store_t *Ivy_CutComputeForNode(Ivy_Man_t *, Ivy_Obj_t *, int)"
                         );
          }
          uVar15 = (uint)*(byte *)(lVar9 + 0xbcf128 + lVar19 * 4);
          uVar4 = Ivy_CutReadLeaf((Ivy_Obj_t *)((ulong)pIVar7->pFanin0 & 0xfffffffffffffffe));
          uVar5 = Ivy_CutReadLeaf((Ivy_Obj_t *)((ulong)pIVar7->pFanin1 & 0xfffffffffffffffe));
          if ((0xfe < (uVar4 & 0xff) + uVar15) || (0xfe < (uVar5 & 0xff) + uVar15)) {
            __assert_fail("nLats + Ivy_LeafLat(iLeaf0) < IVY_LEAF_MASK && nLats + Ivy_LeafLat(iLeaf1) < IVY_LEAF_MASK"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivySeq.c"
                          ,0x42b,"Ivy_Store_t *Ivy_CutComputeForNode(Ivy_Man_t *, Ivy_Obj_t *, int)"
                         );
          }
          iVar6 = uVar15 + uVar4;
          iVar16 = uVar15 + uVar5;
          uVar2 = Ivy_CutComputeForNode::CutStore.pCuts[lVar11].nSize;
          sVar1 = Ivy_CutComputeForNode::CutStore.pCuts[lVar11].nSizeMax;
          if (sVar1 <= (short)uVar2) {
            uVar14 = 0;
            if (0 < (short)uVar2) {
              uVar14 = (ulong)uVar2;
            }
            uVar12 = 0;
            do {
              if (uVar14 == uVar12) goto LAB_00630de7;
              iVar17 = *(int *)(lVar20 + uVar12 * 4);
            } while ((iVar17 != iVar6) && (uVar12 = uVar12 + 1, iVar17 != iVar16));
          }
          iVar17 = iVar16;
          if ((int)uVar5 < (int)uVar4) {
            iVar17 = iVar6;
            iVar6 = iVar16;
          }
          if ((short)uVar2 < 1) {
            __assert_fail("pCut->nSize > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivySeq.c"
                          ,0x2d6,"int Ivy_CutDeriveNew(Ivy_Cut_t *, Ivy_Cut_t *, int, int, int)");
          }
          if (iVar17 <= iVar6) {
            __assert_fail("IdNew0 < IdNew1",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivySeq.c"
                          ,0x2d7,"int Ivy_CutDeriveNew(Ivy_Cut_t *, Ivy_Cut_t *, int, int, int)");
          }
          iVar16 = *(int *)(lVar9 + 0xbcf128 + lVar19 * 4);
          uVar4 = 0;
          iVar13 = 0;
          for (uVar14 = 0; uVar2 != uVar14; uVar14 = uVar14 + 1) {
            iVar3 = *(int *)(lVar20 + uVar14 * 4);
            if (iVar3 != iVar16) {
              iVar10 = iVar6;
              if ((iVar6 <= iVar3) && (iVar10 = 0x7fffffff, iVar6 < iVar3)) {
                CutNew.pArray[iVar13] = iVar6;
                uVar4 = uVar4 | 1 << (iVar6 % 0x1f & 0x1fU);
                iVar13 = iVar13 + 1;
              }
              iVar18 = iVar17;
              if ((iVar17 <= iVar3) && (iVar18 = 0x7fffffff, iVar17 < iVar3)) {
                lVar8 = (long)iVar13;
                iVar13 = iVar13 + 1;
                CutNew.pArray[lVar8] = iVar17;
                uVar4 = uVar4 | 1 << (iVar17 % 0x1f & 0x1fU);
              }
              lVar8 = (long)iVar13;
              iVar13 = iVar13 + 1;
              CutNew.pArray[lVar8] = iVar3;
              uVar4 = uVar4 | 1 << (iVar3 % 0x1f & 0x1fU);
              iVar6 = iVar10;
              iVar17 = iVar18;
            }
          }
          iVar16 = iVar13;
          if (iVar6 != 0x7fffffff) {
            iVar16 = iVar13 + 1;
            CutNew.pArray[iVar13] = iVar6;
            uVar4 = uVar4 | 1 << (iVar6 % 0x1f & 0x1fU);
          }
          CutNew.uHash = uVar4;
          if (iVar17 != 0x7fffffff) {
            lVar8 = (long)iVar16;
            iVar16 = iVar16 + 1;
            CutNew.pArray[lVar8] = iVar17;
            CutNew.uHash = uVar4 | 1 << (iVar17 % 0x1f & 0x1fU);
          }
          CutNew.nSize = (short)iVar16;
          if (sVar1 < CutNew.nSize) {
            __assert_fail("pCutNew->nSize <= pCut->nSizeMax",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivySeq.c"
                          ,0x2fd,"int Ivy_CutDeriveNew(Ivy_Cut_t *, Ivy_Cut_t *, int, int, int)");
          }
          Ivy_CutFindOrAddFilter(&Ivy_CutComputeForNode::CutStore,&CutNew);
          if (Ivy_CutComputeForNode::CutStore.nCuts == 0x100) {
            Ivy_CutComputeForNode::CutStore.fSatur = 1;
            goto LAB_00630e51;
          }
        }
LAB_00630de7:
        sVar1 = Ivy_CutComputeForNode::CutStore.pCuts[lVar11].nSize;
      }
      iVar6 = Ivy_CutComputeForNode::CutStore.nCuts;
      if (Ivy_CutComputeForNode::CutStore.nCuts == 0x100) {
        iVar6 = 0x100;
        goto LAB_00630e47;
      }
    }
    lVar11 = lVar11 + 1;
    lVar20 = lVar20 + 0x24;
  } while( true );
}

Assistant:

Ivy_Store_t * Ivy_CutComputeForNode( Ivy_Man_t * p, Ivy_Obj_t * pObj, int nLeaves )
{
    static Ivy_Store_t CutStore, * pCutStore = &CutStore;
    Ivy_Cut_t CutNew, * pCutNew = &CutNew, * pCut;
    Ivy_Obj_t * pLeaf;
    int i, k, Temp, nLats, iLeaf0, iLeaf1;

    assert( nLeaves <= IVY_CUT_INPUT );

    // start the structure
    pCutStore->nCuts = 0;
    pCutStore->nCutsMax = IVY_CUT_LIMIT;
    // start the trivial cut
    pCutNew->uHash = 0;
    pCutNew->nSize = 1;
    pCutNew->nSizeMax = nLeaves;
    pCutNew->pArray[0] = Ivy_LeafCreate( pObj->Id, 0 );
    pCutNew->uHash = Ivy_CutHashValue( pCutNew->pArray[0] );
    // add the trivial cut
    pCutStore->pCuts[pCutStore->nCuts++] = *pCutNew;
    assert( pCutStore->nCuts == 1 );

    // explore the cuts
    for ( i = 0; i < pCutStore->nCuts; i++ )
    {
        // expand this cut
        pCut = pCutStore->pCuts + i;
        if ( pCut->nSize == 0 )
            continue;
        for ( k = 0; k < pCut->nSize; k++ )
        {
            pLeaf = Ivy_ManObj( p, Ivy_LeafId(pCut->pArray[k]) );
            if ( Ivy_ObjIsCi(pLeaf) || Ivy_ObjIsConst1(pLeaf) )
                continue;
            assert( Ivy_ObjIsNode(pLeaf) );
            nLats = Ivy_LeafLat(pCut->pArray[k]);

            // get the fanins fanins
            iLeaf0 = Ivy_CutReadLeaf( Ivy_ObjFanin0(pLeaf) );
            iLeaf1 = Ivy_CutReadLeaf( Ivy_ObjFanin1(pLeaf) );
            assert( nLats + Ivy_LeafLat(iLeaf0) < IVY_LEAF_MASK && nLats + Ivy_LeafLat(iLeaf1) < IVY_LEAF_MASK );
            iLeaf0 = nLats + iLeaf0;
            iLeaf1 = nLats + iLeaf1;
            if ( !Ivy_CutPrescreen( pCut, iLeaf0, iLeaf1 ) )
                continue;
            // the given cut exist
            if ( iLeaf0 > iLeaf1 )
                Temp = iLeaf0, iLeaf0 = iLeaf1, iLeaf1 = Temp;
            // create the new cut
            if ( !Ivy_CutDeriveNew( pCut, pCutNew, pCut->pArray[k], iLeaf0, iLeaf1 ) )
                continue;
            // add the cut
            Ivy_CutFindOrAddFilter( pCutStore, pCutNew );
            if ( pCutStore->nCuts == IVY_CUT_LIMIT )
                break;
        }
        if ( pCutStore->nCuts == IVY_CUT_LIMIT )
            break;
    }
    if ( pCutStore->nCuts == IVY_CUT_LIMIT )
        pCutStore->fSatur = 1;
    else
        pCutStore->fSatur = 0;
//    printf( "%d ", pCutStore->nCuts );
    Ivy_CutCompactAll( pCutStore );
//    printf( "%d \n", pCutStore->nCuts );
//    Ivy_CutPrintForNodes( pCutStore );
    return pCutStore;
}